

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Bool prvTidyTidyMetaCharset(TidyDocImpl *doc)

{
  TidyAllocator *pTVar1;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ctmbstr str;
  Node *element;
  AttVal *pAVar8;
  AttVal *pAVar9;
  tmbstr ptVar10;
  Node *pNVar11;
  Bool BVar12;
  Bool BVar13;
  Node *pNVar14;
  TidyBuffer charsetString;
  TidyBuffer buf;
  TidyBuffer local_70;
  TidyBuffer local_50;
  
  uVar5 = *(uint *)((doc->config).value + 0x3c);
  str = prvTidyGetEncodingNameFromTidyId(uVar5);
  element = prvTidyFindHEAD(doc);
  BVar12 = no;
  BVar13 = no;
  if (str != (ctmbstr)0x0 && element != (Node *)0x0) {
    iVar7 = *(int *)((doc->config).value + 0x35);
    uVar4 = prvTidytmbstrlen(str);
    BVar13 = BVar12;
    if ((((uVar4 != 0) && (uVar5 != 0)) && (uVar5 != 5)) && (*(int *)((doc->config).value + 6) != 1)
       ) {
      tidyBufInit(&local_70);
      tidyBufClear(&local_70);
      tidyBufAppend(&local_70,"charset=",8);
      uVar5 = prvTidytmbstrlen(str);
      tidyBufAppend(&local_70,str,uVar5);
      tidyBufAppend(&local_70,"",1);
      pNVar11 = element->content;
      bVar3 = false;
      if (pNVar11 != (Node *)0x0) {
        bVar3 = false;
        do {
          if ((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->id == TidyTag_META)) {
            pAVar8 = prvTidyAttrGetById(pNVar11,TidyAttr_CHARSET);
            pAVar9 = prvTidyAttrGetById(pNVar11,TidyAttr_HTTP_EQUIV);
            if (pAVar8 != (AttVal *)0x0 || pAVar9 != (AttVal *)0x0) {
              if (pAVar8 == (AttVal *)0x0 || pAVar9 != (AttVal *)0x0) {
                if (pAVar9 == (AttVal *)0x0 || pAVar8 != (AttVal *)0x0) {
                  if (pAVar8 != (AttVal *)0x0 && pAVar9 != (AttVal *)0x0) goto LAB_0014d2db;
                }
                else {
                  pAVar8 = prvTidyAttrGetById(pNVar11,TidyAttr_CONTENT);
                  if (pAVar8 != (AttVal *)0x0) {
                    if (pAVar9->value == (ctmbstr)0x0) goto LAB_0014d2db;
                    iVar6 = prvTidytmbstrcasecmp(pAVar9->value,"content-type");
                    if ((iVar6 == 0) && (pAVar8->value != (ctmbstr)0x0)) {
                      iVar6 = prvTidytmbstrcasecmp(pAVar8->value,(ctmbstr)local_70.bp);
                      pNVar14 = pNVar11;
                      if (iVar6 == 0) {
                        if (bVar3) {
                          pNVar14 = pNVar11->prev;
                          prvTidyReport(doc,element,pNVar11,0x235);
                          prvTidyDiscardElement(doc,pNVar11);
                        }
                      }
                      else {
                        if (bVar3) {
                          pNVar14 = pNVar11->prev;
                          prvTidyReport(doc,element,pNVar11,0x235);
                          prvTidyDiscardElement(doc,pNVar11);
                          bVar3 = true;
                          pNVar11 = pNVar14;
                          goto LAB_0014d302;
                        }
                        pTVar1 = doc->allocator;
                        p_Var2 = pTVar1->vtbl->alloc;
                        uVar5 = prvTidytmbstrlen(str);
                        ptVar10 = (tmbstr)(*p_Var2)(pTVar1,(long)uVar5 + 0x14);
                        prvTidytmbstrcpy(ptVar10,"text/html; charset=");
                        prvTidytmbstrcpy(ptVar10 + 0x13,str);
                        if (*(int *)((doc->config).value + 0x4d) != 0) {
                          prvTidyReportAttrError(doc,pNVar11,pAVar8,0x228);
                        }
                        (*doc->allocator->vtbl->free)(doc->allocator,pAVar8->value);
                        pAVar8->value = ptVar10;
                      }
                      bVar3 = true;
                      pNVar11 = pNVar14;
                    }
                  }
                }
              }
              else if ((bVar3) || (pAVar8->value == (ctmbstr)0x0)) {
LAB_0014d2db:
                pNVar14 = pNVar11->prev;
                prvTidyReport(doc,element,pNVar11,0x235);
                prvTidyDiscardElement(doc,pNVar11);
                pNVar11 = pNVar14;
              }
              else {
                iVar6 = prvTidytmbstrcasecmp(pAVar8->value,str);
                if (iVar6 != 0) {
                  pTVar1 = doc->allocator;
                  p_Var2 = pTVar1->vtbl->alloc;
                  uVar5 = prvTidytmbstrlen(str);
                  ptVar10 = (tmbstr)(*p_Var2)(pTVar1,(long)uVar5 + 1);
                  prvTidytmbstrcpy(ptVar10,str);
                  prvTidyReportAttrError(doc,pNVar11,pAVar8,0x228);
                  (*doc->allocator->vtbl->free)(doc->allocator,pAVar8->value);
                  pAVar8->value = ptVar10;
                }
                bVar3 = true;
                if (pNVar11 != element->content->next) {
                  prvTidyRemoveNode(pNVar11);
                  prvTidyInsertNodeAtStart(element,pNVar11);
                }
              }
            }
          }
LAB_0014d302:
          if (pNVar11 == (Node *)0x0) {
            pNVar11 = (Node *)0x0;
          }
          else {
            pNVar11 = pNVar11->next;
          }
        } while (pNVar11 != (Node *)0x0);
      }
      if (!(bool)(iVar7 == 0 | bVar3)) {
        pNVar11 = prvTidyInferredTag(doc,TidyTag_META);
        iVar7 = prvTidyHTMLVersion(doc);
        if ((iVar7 == 0x40000) || (iVar7 == 0x20000)) {
          prvTidyAddAttribute(doc,pNVar11,"charset",str);
        }
        else {
          tidyBufInit(&local_50);
          tidyBufAppend(&local_50,"text/html; ",0xb);
          uVar5 = prvTidytmbstrlen((ctmbstr)local_70.bp);
          tidyBufAppend(&local_50,local_70.bp,uVar5);
          tidyBufAppend(&local_50,"",1);
          prvTidyAddAttribute(doc,pNVar11,"http-equiv","Content-Type");
          prvTidyAddAttribute(doc,pNVar11,"content",(ctmbstr)local_50.bp);
          tidyBufFree(&local_50);
        }
        prvTidyInsertNodeAtStart(element,pNVar11);
        prvTidyReport(doc,pNVar11,element,0x222);
      }
      tidyBufFree(&local_70);
      BVar13 = yes;
    }
  }
  return BVar13;
}

Assistant:

Bool TY_(TidyMetaCharset)(TidyDocImpl* doc)
{
    AttVal *charsetAttr;
    AttVal *contentAttr;
    AttVal *httpEquivAttr;
    Bool charsetFound = no;
    uint outenc = cfg(doc, TidyOutCharEncoding);
    ctmbstr enc = TY_(GetEncodingNameFromTidyId)(outenc);
    Node *currentNode;
    Node *head = TY_(FindHEAD)(doc);
    Node *metaTag;
    Node *prevNode;
    TidyBuffer buf;
    TidyBuffer charsetString;
    /* tmbstr httpEquivAttrValue; */
    /* tmbstr lcontent; */
    tmbstr newValue;
    Bool add_meta = cfgBool(doc, TidyMetaCharset);

    /* We can't do anything we don't have a head or encoding is NULL */
    if (!head || !enc || !TY_(tmbstrlen)(enc))
        return no;
    if (outenc == RAW)
        return no;
#ifndef NO_NATIVE_ISO2022_SUPPORT
    if (outenc == ISO2022)
        return no;
#endif
    if (cfgAutoBool(doc, TidyBodyOnly) == TidyYesState)
        return no; /* nothing to do here if showing body only */

    tidyBufInit(&charsetString);
    /* Set up the content test 'charset=value' */
    tidyBufClear(&charsetString);
    tidyBufAppend(&charsetString, "charset=", 8);
    tidyBufAppend(&charsetString, (char*)enc, TY_(tmbstrlen)(enc));
    tidyBufAppend(&charsetString, "\0", 1); /* zero terminate the buffer */
    /* process the children of the head */
    /* Issue #656 - guard against 'currentNode' being set NULL in loop */
    for (currentNode = head->content; currentNode; 
        currentNode = (currentNode ? currentNode->next : NULL))
    {
        if (!nodeIsMETA(currentNode))
            continue;   /* not a meta node */
        charsetAttr = attrGetCHARSET(currentNode);
        httpEquivAttr = attrGetHTTP_EQUIV(currentNode);
        if (!charsetAttr && !httpEquivAttr)
            continue;   /* has no charset attribute */
                        /*
                        Meta charset comes in quite a few flavors:
                        1. <meta charset="value"> - expected for (X)HTML5.
                        */
        if (charsetAttr && !httpEquivAttr)
        {
            /* we already found one, so remove the rest. */
            if (charsetFound || !charsetAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            charsetFound = yes;
            /* Fix mismatched attribute value */
            if (TY_(tmbstrcasecmp)(charsetAttr->value, enc) != 0)
            {
                newValue = (tmbstr)TidyDocAlloc(doc, TY_(tmbstrlen)(enc) + 1);   /* allocate + 1 for 0 */
                TY_(tmbstrcpy)(newValue, enc);
                /* Note: previously http-equiv had been modified, without warning
                in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
                */
                TY_(ReportAttrError)(doc, currentNode, charsetAttr, ATTRIBUTE_VALUE_REPLACED);
                TidyDocFree(doc, charsetAttr->value);   /* free current value */
                charsetAttr->value = newValue;
            }
            /* Make sure it's the first element. */
            if (currentNode != head->content->next) {
                TY_(RemoveNode)(currentNode);
                TY_(InsertNodeAtStart)(head, currentNode);
            }
            continue;
        }
        /*
        2. <meta http-equiv="content-type" content="text/html; charset=UTF-8">
        expected for HTML4. This is normally ok - but can clash.
        */
        if (httpEquivAttr && !charsetAttr)
        {
            contentAttr = TY_(AttrGetById)(currentNode, TidyAttr_CONTENT);
            if (!contentAttr)
                continue;   /* has no 'content' attribute */
            if (!httpEquivAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            /* httpEquivAttrValue = TY_(tmbstrtolower)(httpEquivAttr->value); */
            if (TY_(tmbstrcasecmp)(httpEquivAttr->value, (tmbstr) "content-type") != 0)
                continue;   /* is not 'content-type' */
            if (!contentAttr->value)
            {
                continue; /* has no 'content' attribute has NO VALUE! */
            }
            /* check encoding matches
            If a miss-match found here, fix it. previous silently done
            in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
            lcontent = TY_(tmbstrtolower)(contentAttr->value);
            */
            if (TY_(tmbstrcasecmp)(contentAttr->value, (ctmbstr)charsetString.bp) == 0)
            {
                /* we already found one, so remove the rest. */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                    continue;
                }
                charsetFound = yes;
            }
            else
            {
                /* fix a mismatch */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                }
                else
                {
                    /* correct the content */
                    newValue = (tmbstr)TidyDocAlloc(doc, 19 + TY_(tmbstrlen)(enc) + 1);
                    TY_(tmbstrcpy)(newValue, "text/html; charset=");
                    TY_(tmbstrcpy)(newValue + 19, enc);
                    if (cfgBool(doc, TidyShowMetaChange))   /* Issue #456 - backward compatibility only */
                        TY_(ReportAttrError)(doc, currentNode, contentAttr, ATTRIBUTE_VALUE_REPLACED);
                    TidyDocFree(doc, contentAttr->value);
                    contentAttr->value = newValue;
                    charsetFound = yes;
                }
            }
            continue;
        }
        /*
        3. <meta charset="utf-8" http-equiv="Content-Type" content="...">
        This is generally bad. Discard and warn.
        */
        if (httpEquivAttr && charsetAttr)
        {
            /* printf("WARN ABOUT HTTP EQUIV AND CHARSET ATTR! \n"); */
            prevNode = currentNode->prev;
            TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
            TY_(DiscardElement)(doc, currentNode);
            currentNode = prevNode;
        }
    }

    /* completed head scan - add appropriate meta - if 'yes' and none exists */
    if (add_meta && !charsetFound)
    {
        /* add appropriate meta charset tag - no warning */
        metaTag = TY_(InferredTag)(doc, TidyTag_META);
        switch (TY_(HTMLVersion)(doc))
        {
        case HT50:
        case XH50:
            TY_(AddAttribute)(doc, metaTag, "charset", enc);
            break;
        default:
            tidyBufInit(&buf);
            tidyBufAppend(&buf, "text/html; ", 11);
            tidyBufAppend(&buf, charsetString.bp, TY_(tmbstrlen)((ctmbstr)charsetString.bp));
            tidyBufAppend(&buf, "\0", 1);   /* zero terminate the buffer */
            TY_(AddAttribute)(doc, metaTag, "http-equiv", "Content-Type"); /* add 'http-equiv' const. */
            TY_(AddAttribute)(doc, metaTag, "content", (char*)buf.bp);  /* add 'content="<enc>"' */
            tidyBufFree(&buf);
        }
        TY_(InsertNodeAtStart)(head, metaTag);
        TY_(Report)(doc, metaTag, head, ADDED_MISSING_CHARSET); /* actually just 'Info:' */
    }
    tidyBufFree(&charsetString);
    return yes;
}